

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPair.hpp
# Opt level: O2

void __thiscall antlr::ASTPair::~ASTPair(ASTPair *this)

{
  ASTRefCount<antlr::AST>::~ASTRefCount(&this->child);
  ASTRefCount<antlr::AST>::~ASTRefCount(&this->root);
  return;
}

Assistant:

class ANTLR_API ASTPair {
public:
	RefAST root;		// current root of tree
	RefAST child;		// current child to which siblings are added

	/** Make sure that child is the last sibling */
	void advanceChildToEnd() {
		if (child) {
			while (child->getNextSibling()) {
				child = child->getNextSibling();
			}
		}
	}
//	/** Copy an ASTPair.  Don't call it clone() because we want type-safety */
//	ASTPair copy() {
//		ASTPair tmp = new ASTPair();
//		tmp.root = root;
//		tmp.child = child;
//		return tmp;
//	}
	ANTLR_USE_NAMESPACE(std)string toString() const {
		ANTLR_USE_NAMESPACE(std)string r = !root ? ANTLR_USE_NAMESPACE(std)string("null") : root->getText();
		ANTLR_USE_NAMESPACE(std)string c = !child ? ANTLR_USE_NAMESPACE(std)string("null") : child->getText();
		return "["+r+","+c+"]";
	}
}